

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

bool __thiscall cmQtAutoGenInitializer::InitAutogenTarget(cmQtAutoGenInitializer *this)

{
  anon_struct_456_13_9a36c67e_for_AutogenTarget *utilityName;
  cmGlobalGenerator *pcVar1;
  pointer pcVar2;
  cmGeneratorTarget *this_00;
  pointer pcVar3;
  char *workingDirectory;
  _Alloc_hider comment;
  byte bVar4;
  TargetType TVar5;
  cmMakefile *this_01;
  cmLocalGenerator *lg;
  string *psVar6;
  long lVar7;
  string *psVar8;
  _Rb_tree_node_base *p_Var9;
  cmLinkImplementationLibraries *pcVar10;
  mapped_type_conflict2 *pmVar11;
  cmTarget *pcVar12;
  cmGeneratorTarget *pcVar13;
  set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *psVar14;
  cmLinkItem *item;
  pointer pcVar15;
  pointer pcVar16;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar17;
  cmCustomCommandLine currentLine;
  cmGeneratorTarget *local_270;
  string autogenComment;
  _Alloc_hider local_230;
  string tools;
  pointer local_208;
  pointer pbStack_200;
  pointer local_1f8;
  cmCustomCommandLines commandLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  autogenProvides;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_deps;
  cmGeneratorTarget *libTarget;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  this_01 = cmTarget::GetMakefile(this->Target->Target);
  lg = cmGeneratorTarget::GetLocalGenerator(this->Target);
  pcVar1 = lg->GlobalGenerator;
  psVar8 = &(this->AutogenTarget).InfoFile;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this_01->OutputFiles,psVar8);
  autogenProvides.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  autogenProvides.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  autogenProvides.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = (this->Moc).super_GenVarsT.Enabled;
  if ((bool)bVar4 == true) {
    psVar6 = &(this->Moc).MocsCompilation;
    AddGeneratedSource(this,psVar6,&(this->Moc).super_GenVarsT,true);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&autogenProvides,psVar6);
    bVar4 = (this->Moc).super_GenVarsT.Enabled;
  }
  autogenComment._M_dataplus._M_p = (pointer)&autogenComment.field_2;
  autogenComment._M_string_length = 0;
  autogenComment.field_2._M_local_buf[0] = '\0';
  tools._M_dataplus._M_p = (pointer)&tools.field_2;
  tools._M_string_length = 0;
  tools.field_2._M_allocated_capacity = tools.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if ((bVar4 & 1) != 0) {
    std::__cxx11::string::append((char *)&tools);
  }
  if ((this->Uic).super_GenVarsT.Enabled == true) {
    if (tools._M_string_length != 0) {
      std::__cxx11::string::append((char *)&tools);
    }
    std::__cxx11::string::append((char *)&tools);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&autogenComment,0,(char *)autogenComment._M_string_length,0x5a4342);
  std::__cxx11::string::_M_append((char *)&autogenComment,(ulong)tools._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&autogenComment);
  psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
  std::__cxx11::string::_M_append((char *)&autogenComment,(ulong)(psVar6->_M_dataplus)._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tools._M_dataplus._M_p != &tools.field_2) {
    operator_delete(tools._M_dataplus._M_p,tools.field_2._M_allocated_capacity + 1);
  }
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar6 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&currentLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ,psVar6);
  tools._M_dataplus._M_p = (pointer)&tools.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tools,"-E","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&currentLine,
             &tools);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tools._M_dataplus._M_p != &tools.field_2) {
    operator_delete(tools._M_dataplus._M_p,tools.field_2._M_allocated_capacity + 1);
  }
  tools._M_dataplus._M_p = (pointer)&tools.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tools,"cmake_autogen","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&currentLine,
             &tools);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tools._M_dataplus._M_p != &tools.field_2) {
    operator_delete(tools._M_dataplus._M_p,tools.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&currentLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ,psVar8);
  tools._M_dataplus._M_p = (pointer)&tools.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tools,"$<CONFIGURATION>","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&currentLine,
             &tools);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tools._M_dataplus._M_p != &tools.field_2) {
    operator_delete(tools._M_dataplus._M_p,tools.field_2._M_allocated_capacity + 1);
  }
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
  emplace_back<cmCustomCommandLine>
            (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
             &currentLine);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&currentLine.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  (*pcVar1->_vptr_cmGlobalGenerator[3])(&tools,pcVar1);
  lVar7 = std::__cxx11::string::find((char *)&tools,0x5a436c,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tools._M_dataplus._M_p != &tools.field_2) {
    operator_delete(tools._M_dataplus._M_p,tools.field_2._M_allocated_capacity + 1);
  }
  if (((lVar7 == -1) || ((this->AutogenTarget).GlobalTarget != false)) ||
     ((this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    if ((this->AutogenTarget).DependOrigin == true) {
      no_deps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)no_deps.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
      no_deps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      psVar8 = (this->ConfigsList).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar6 = (this->ConfigsList).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (psVar8 != psVar6) {
        do {
          pcVar10 = cmGeneratorTarget::GetLinkImplementationLibraries(this->Target,psVar8);
          if (pcVar10 != (cmLinkImplementationLibraries *)0x0) {
            pcVar2 = (pcVar10->Libraries).
                     super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (pcVar16 = (pcVar10->Libraries).
                           super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>.
                           _M_impl.super__Vector_impl_data._M_start; pcVar16 != pcVar2;
                pcVar16 = pcVar16 + 1) {
              pcVar13 = (pcVar16->super_cmLinkItem).Target;
              libTarget = pcVar13;
              if (pcVar13 != (cmGeneratorTarget *)0x0) {
                this_00 = this->Target;
                local_270 = pcVar13;
                TVar5 = cmGeneratorTarget::GetType(this_00);
                if ((TVar5 == STATIC_LIBRARY) &&
                   (TVar5 = cmGeneratorTarget::GetType(pcVar13), TVar5 == STATIC_LIBRARY)) {
                  currentLine.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       (pointer)((ulong)currentLine.
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish &
                                0xffffffff00000000);
                  currentLine.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_208 = (pointer)0x0;
                  pbStack_200 = (pointer)0x0;
                  tools.field_2._M_allocated_capacity = 0;
                  tools.field_2._8_8_ = 0;
                  tools._M_dataplus._M_p = (pointer)0x0;
                  tools._M_string_length = 0;
                  std::
                  _Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ::_M_initialize_map((_Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                                       *)&tools,0);
                  std::
                  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                  ::_M_insert_unique<cmGeneratorTarget_const*const&>
                            ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                              *)&currentLine,&local_270);
                  pcRam0000000000000000 = local_270;
                  local_1f8 = (pointer)0x8;
                  if (tools.field_2._M_allocated_capacity != 8) {
                    do {
                      pcVar13 = *(cmGeneratorTarget **)tools.field_2._M_allocated_capacity;
                      if ((undefined1 *)tools.field_2._M_allocated_capacity ==
                          (undefined1 *)((long)&local_208[-1].field_2 + 8U)) {
                        operator_delete((void *)tools.field_2._8_8_,0x200);
                        tools.field_2._M_allocated_capacity = pbStack_200->_M_string_length;
                        local_208 = (pointer)(tools.field_2._M_allocated_capacity + 0x200);
                        tools.field_2._8_8_ = tools.field_2._M_allocated_capacity;
                        pbStack_200 = (pointer)&pbStack_200->_M_string_length;
                      }
                      else {
                        tools.field_2._M_allocated_capacity =
                             tools.field_2._M_allocated_capacity + 8;
                      }
                      if (pcVar13 == this_00) {
                        std::
                        _Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                        ::~_Deque_base((_Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                                        *)&tools);
                        std::
                        _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                        ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                                     *)&currentLine);
                        goto LAB_0024aaa7;
                      }
                      pcVar10 = cmGeneratorTarget::GetLinkImplementationLibraries(pcVar13,psVar8);
                      if (pcVar10 != (cmLinkImplementationLibraries *)0x0) {
                        pcVar3 = (pcVar10->Libraries).
                                 super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                        for (pcVar15 = (pcVar10->Libraries).
                                       super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
                                       ._M_impl.super__Vector_impl_data._M_start; pcVar15 != pcVar3;
                            pcVar15 = pcVar15 + 1) {
                          local_230._M_p = (pointer)(pcVar15->super_cmLinkItem).Target;
                          if ((((cmGeneratorTarget *)local_230._M_p != (cmGeneratorTarget *)0x0) &&
                              (TVar5 = cmGeneratorTarget::GetType
                                                 ((cmGeneratorTarget *)local_230._M_p),
                              TVar5 == STATIC_LIBRARY)) &&
                             (pVar17 = std::
                                       _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                                       ::_M_insert_unique<cmGeneratorTarget_const*const&>
                                                 ((
                                                  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                                                  *)&currentLine,(cmGeneratorTarget **)&local_230),
                             ((undefined1  [16])pVar17 & (undefined1  [16])0x1) !=
                             (undefined1  [16])0x0)) {
                            if (local_1f8 == (pointer)0xfffffffffffffff8) {
                              std::
                              deque<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>
                              ::_M_push_back_aux<cmGeneratorTarget_const*const&>
                                        ((deque<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>
                                          *)&tools,(cmGeneratorTarget **)&local_230);
                            }
                            else {
                              (local_1f8->_M_dataplus)._M_p = local_230._M_p;
                              local_1f8 = (pointer)&local_1f8->_M_string_length;
                            }
                          }
                        }
                      }
                    } while (local_1f8 != (pointer)tools.field_2._M_allocated_capacity);
                  }
                  std::
                  _Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ::~_Deque_base((_Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                                  *)&tools);
                  std::
                  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                  ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                               *)&currentLine);
                }
                pmVar11 = std::
                          map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                          ::operator[]((map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                                        *)&no_deps,&libTarget);
                *pmVar11 = *pmVar11 + 1;
              }
LAB_0024aaa7:
            }
          }
          psVar8 = psVar8 + 1;
        } while (psVar8 != psVar6);
      }
      std::
      _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_long>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
      ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_long>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                   *)&no_deps);
    }
    workingDirectory = (this->Dir).Work._M_dataplus._M_p;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    vector<std::_Rb_tree_const_iterator<std::__cxx11::string>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&currentLine,
               (this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_left,(_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )&(this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header,
               (allocator_type *)&no_deps);
    comment = autogenComment._M_dataplus;
    tools._M_dataplus._M_p = (pointer)&tools.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&tools,"");
    utilityName = &this->AutogenTarget;
    pcVar12 = cmMakefile::AddUtilityCommand
                        (this_01,&utilityName->Name,Generator,true,workingDirectory,&autogenProvides
                         ,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&currentLine,&commandLines,false,comment._M_p,false,false,&tools);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tools._M_dataplus._M_p != &tools.field_2) {
      operator_delete(tools._M_dataplus._M_p,tools.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&currentLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    pcVar13 = (cmGeneratorTarget *)operator_new(0x5a8);
    cmGeneratorTarget::cmGeneratorTarget(pcVar13,pcVar12,lg);
    cmLocalGenerator::AddGeneratorTarget(lg,pcVar13);
    if ((this->AutogenTarget).DependOrigin == true) {
      psVar14 = cmGeneratorTarget::GetUtilities_abi_cxx11_(this->Target);
      for (p_Var9 = (psVar14->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != &(psVar14->_M_t)._M_impl.super__Rb_tree_header;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        cmTarget::AddUtility(pcVar12,(string *)(p_Var9 + 1),this_01);
      }
    }
    for (p_Var9 = (this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
        (_Rb_tree_header *)p_Var9 !=
        &(this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      psVar8 = cmTarget::GetName_abi_cxx11_(*(cmTarget **)(p_Var9 + 1));
      cmTarget::AddUtility(pcVar12,psVar8,this_01);
    }
    if ((this->TargetsFolder)._M_string_length != 0) {
      tools._M_dataplus._M_p = (pointer)&tools.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&tools,"FOLDER","");
      cmTarget::SetProperty(pcVar12,&tools,(this->TargetsFolder)._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tools._M_dataplus._M_p != &tools.field_2) {
        operator_delete(tools._M_dataplus._M_p,tools.field_2._M_allocated_capacity + 1);
      }
    }
    cmTarget::AddUtility(this->Target->Target,&utilityName->Name,this_01);
    if ((this->AutogenTarget).GlobalTarget == true) {
      cmQtAutoGenGlobalInitializer::AddToGlobalAutoGen
                (this->GlobalInitializer,lg,&utilityName->Name);
    }
  }
  else {
    for (p_Var9 = (this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
        (_Rb_tree_header *)p_Var9 !=
        &(this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      pcVar12 = this->Target->Target;
      psVar8 = cmTarget::GetName_abi_cxx11_(*(cmTarget **)(p_Var9 + 1));
      cmTarget::AddUtility(pcVar12,psVar8,this_01);
    }
    currentLine.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    currentLine.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    currentLine.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    no_deps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    no_deps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    no_deps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,
             &currentLine.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_60,&autogenProvides);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_78,&no_deps);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
              (&local_90,
               &commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
              );
    cmCustomCommand::cmCustomCommand
              ((cmCustomCommand *)&tools,this_01,&local_48,&local_60,&local_78,
               (cmCustomCommandLines *)&local_90,autogenComment._M_dataplus._M_p,
               (this->Dir).Work._M_dataplus._M_p);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_90);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    cmCustomCommand::SetEscapeOldStyle((cmCustomCommand *)&tools,false);
    cmCustomCommand::SetEscapeAllowMakeVars((cmCustomCommand *)&tools,true);
    cmTarget::AddPreBuildCommand(this->Target->Target,(cmCustomCommand *)&tools);
    cmCustomCommand::~cmCustomCommand((cmCustomCommand *)&tools);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&no_deps);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&currentLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  }
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
            (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)autogenComment._M_dataplus._M_p != &autogenComment.field_2) {
    operator_delete(autogenComment._M_dataplus._M_p,
                    CONCAT71(autogenComment.field_2._M_allocated_capacity._1_7_,
                             autogenComment.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&autogenProvides);
  return true;
}

Assistant:

bool cmQtAutoGenInitializer::InitAutogenTarget()
{
  cmMakefile* makefile = this->Target->Target->GetMakefile();
  cmLocalGenerator* localGen = this->Target->GetLocalGenerator();
  cmGlobalGenerator* globalGen = localGen->GetGlobalGenerator();

  // Register info file as generated by CMake
  makefile->AddCMakeOutputFile(this->AutogenTarget.InfoFile);

  // Files provided by the autogen target
  std::vector<std::string> autogenProvides;
  if (this->Moc.Enabled) {
    this->AddGeneratedSource(this->Moc.MocsCompilation, this->Moc, true);
    autogenProvides.push_back(this->Moc.MocsCompilation);
  }

  // Compose target comment
  std::string autogenComment;
  {
    std::string tools;
    if (this->Moc.Enabled) {
      tools += "MOC";
    }
    if (this->Uic.Enabled) {
      if (!tools.empty()) {
        tools += " and ";
      }
      tools += "UIC";
    }
    autogenComment = "Automatic ";
    autogenComment += tools;
    autogenComment += " for target ";
    autogenComment += this->Target->GetName();
  }

  // Compose command lines
  cmCustomCommandLines commandLines;
  {
    cmCustomCommandLine currentLine;
    currentLine.push_back(cmSystemTools::GetCMakeCommand());
    currentLine.push_back("-E");
    currentLine.push_back("cmake_autogen");
    currentLine.push_back(this->AutogenTarget.InfoFile);
    currentLine.push_back("$<CONFIGURATION>");
    commandLines.push_back(std::move(currentLine));
  }

  // Use PRE_BUILD on demand
  bool usePRE_BUILD = false;
  if (globalGen->GetName().find("Visual Studio") != std::string::npos) {
    // Under VS use a PRE_BUILD event instead of a separate target to
    // reduce the number of targets loaded into the IDE.
    // This also works around a VS 11 bug that may skip updating the target:
    //  https://connect.microsoft.com/VisualStudio/feedback/details/769495
    usePRE_BUILD = true;
  }
  // Disable PRE_BUILD in some cases
  if (usePRE_BUILD) {
    // Cannot use PRE_BUILD with file depends
    if (!this->AutogenTarget.DependFiles.empty()) {
      usePRE_BUILD = false;
    }
    // Cannot use PRE_BUILD when a global autogen target is in place
    if (AutogenTarget.GlobalTarget) {
      usePRE_BUILD = false;
    }
  }
  // Create the autogen target/command
  if (usePRE_BUILD) {
    // Add additional autogen target dependencies to origin target
    for (cmTarget* depTarget : this->AutogenTarget.DependTargets) {
      this->Target->Target->AddUtility(depTarget->GetName(), makefile);
    }

    // Add the pre-build command directly to bypass the OBJECT_LIBRARY
    // rejection in cmMakefile::AddCustomCommandToTarget because we know
    // PRE_BUILD will work for an OBJECT_LIBRARY in this specific case.
    //
    // PRE_BUILD does not support file dependencies!
    const std::vector<std::string> no_output;
    const std::vector<std::string> no_deps;
    cmCustomCommand cc(makefile, no_output, autogenProvides, no_deps,
                       commandLines, autogenComment.c_str(),
                       this->Dir.Work.c_str());
    cc.SetEscapeOldStyle(false);
    cc.SetEscapeAllowMakeVars(true);
    this->Target->Target->AddPreBuildCommand(cc);
  } else {

    // Add link library target dependencies to the autogen target
    // dependencies
    if (this->AutogenTarget.DependOrigin) {
      // add_dependencies/addUtility do not support generator expressions.
      // We depend only on the libraries found in all configs therefore.
      std::map<cmGeneratorTarget const*, std::size_t> commonTargets;
      for (std::string const& config : this->ConfigsList) {
        cmLinkImplementationLibraries const* libs =
          this->Target->GetLinkImplementationLibraries(config);
        if (libs != nullptr) {
          for (cmLinkItem const& item : libs->Libraries) {
            cmGeneratorTarget const* libTarget = item.Target;
            if ((libTarget != nullptr) &&
                !StaticLibraryCycle(this->Target, libTarget, config)) {
              // Increment target config count
              commonTargets[libTarget]++;
            }
          }
        }
      }
      for (auto const& item : commonTargets) {
        if (item.second == this->ConfigsList.size()) {
          this->AutogenTarget.DependTargets.insert(item.first->Target);
        }
      }
    }

    // Create autogen target
    cmTarget* autogenTarget = makefile->AddUtilityCommand(
      this->AutogenTarget.Name, cmMakefile::TargetOrigin::Generator, true,
      this->Dir.Work.c_str(), /*byproducts=*/autogenProvides,
      std::vector<std::string>(this->AutogenTarget.DependFiles.begin(),
                               this->AutogenTarget.DependFiles.end()),
      commandLines, false, autogenComment.c_str());
    // Create autogen generator target
    localGen->AddGeneratorTarget(
      new cmGeneratorTarget(autogenTarget, localGen));

    // Forward origin utilities to autogen target
    if (this->AutogenTarget.DependOrigin) {
      for (BT<std::string> const& depName : this->Target->GetUtilities()) {
        autogenTarget->AddUtility(depName.Value, makefile);
      }
    }
    // Add additional autogen target dependencies to autogen target
    for (cmTarget* depTarget : this->AutogenTarget.DependTargets) {
      autogenTarget->AddUtility(depTarget->GetName(), makefile);
    }

    // Set FOLDER property in autogen target
    if (!this->TargetsFolder.empty()) {
      autogenTarget->SetProperty("FOLDER", this->TargetsFolder.c_str());
    }

    // Add autogen target to the origin target dependencies
    this->Target->Target->AddUtility(this->AutogenTarget.Name, makefile);

    // Add autogen target to the global autogen target dependencies
    if (this->AutogenTarget.GlobalTarget) {
      this->GlobalInitializer->AddToGlobalAutoGen(localGen,
                                                  this->AutogenTarget.Name);
    }
  }

  return true;
}